

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::PortalImageInfiniteLight::PDF_Le
          (PortalImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float *in_RCX;
  float *in_RDX;
  long in_RDI;
  Float FVar1;
  float fVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  Vector3<float> VVar8;
  Float pdf;
  Bounds2f b;
  Point2f st;
  Float duv_dw;
  Vector3f w;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Bounds2f *in_stack_ffffffffffffff78;
  Bounds2<float> *in_stack_ffffffffffffff80;
  WindowedPiecewiseConstant2D *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_64;
  undefined4 in_stack_ffffffffffffffbc;
  Vector3f *wRender;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 extraout_var [56];
  
  auVar6 = in_ZMM0._8_56_;
  VVar8 = Normalize<float>((Vector3<float> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  fVar7 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  wRender = (Vector3f *)vmovlpd_avx(auVar3._0_16_);
  fVar2 = fVar7;
  VVar8 = Tuple3<pbrt::Vector3,_float>::operator-
                    ((Tuple3<pbrt::Vector3,_float> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  vmovlpd_avx(auVar4._0_16_);
  auVar5._0_8_ = ImageFromRender((PortalImageInfiniteLight *)
                                 CONCAT44(in_stack_ffffffffffffffcc,fVar2),wRender,
                                 (Float *)CONCAT44(in_stack_ffffffffffffffbc,fVar7));
  auVar5._8_56_ = extraout_var;
  vmovlpd_avx(auVar5._0_16_);
  if ((local_64 != 0.0) || (NAN(local_64))) {
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (float)((ulong)in_RDI >> 0x20),(float)in_RDI);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (float)((ulong)in_RDI >> 0x20),(float)in_RDI);
    Bounds2<float>::Bounds2
              (in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->pMin,
               (Point2<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    FVar1 = WindowedPiecewiseConstant2D::PDF
                      (in_stack_ffffffffffffff88,&in_stack_ffffffffffffff80->pMin,
                       in_stack_ffffffffffffff78);
    fVar2 = Sqr<float>(*(float *)(in_RDI + 0x27c));
    *in_RDX = 1.0 / (fVar2 * 3.1415927);
    *in_RCX = FVar1 / local_64;
  }
  else {
    *in_RCX = 0.0;
    *in_RDX = 0.0;
  }
  return;
}

Assistant:

void PortalImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos,
                                      Float *pdfDir) const {
    // TODO: negate here or???
    Vector3f w = -Normalize(ray.d);
    Float duv_dw;
    Point2f st = ImageFromRender(w, &duv_dw);

    if (duv_dw == 0) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Float pdf = distribution.PDF(st, b);

#if 0
    Normal3f n = Normal3f(portalFrame.z);
    *pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    *pdfDir = pdf / duv_dw;
}